

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  Atom AVar2;
  Display *pDVar3;
  char *pcVar4;
  unsigned_long uVar5;
  size_t sVar6;
  Atom AVar7;
  long lVar8;
  ulong uVar9;
  Window WVar10;
  Atom *pAVar11;
  undefined8 uVar12;
  Atom formats [3];
  Atom targets [5];
  XEvent reply;
  
  AVar7 = 0;
  memset(&reply,0,0xc0);
  pcVar4 = _glfw.x11.clipboardString;
  pDVar3 = _glfw.x11.display;
  formats[0] = _glfw.x11.UTF8_STRING;
  formats[1] = _glfw.x11.COMPOUND_STRING;
  formats[2] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_001124cf;
  AVar2 = (event->xkey).time;
  if (AVar2 == _glfw.x11.TARGETS) {
    pAVar11 = targets;
    targets[0] = _glfw.x11.TARGETS;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = _glfw.x11.COMPOUND_STRING;
    targets[4] = 0x1f;
    WVar10 = (event->xkey).root;
    uVar12 = 5;
    AVar7 = 4;
LAB_001123c6:
    XChangeProperty(_glfw.x11.display,WVar10,AVar1,AVar7,0x20,0,pAVar11,uVar12);
  }
  else {
    if (AVar2 != _glfw.x11.MULTIPLE) {
      if (AVar2 != _glfw.x11.SAVE_TARGETS) {
        AVar7 = 0;
        lVar8 = 0;
        do {
          if (AVar2 == formats[lVar8]) {
            WVar10 = (event->xkey).root;
            sVar6 = strlen(_glfw.x11.clipboardString);
            XChangeProperty(pDVar3,WVar10,AVar1,AVar2,8,0,pcVar4,sVar6);
            AVar7 = (event->xselectionrequest).property;
            break;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        goto LAB_001124cf;
      }
      WVar10 = (event->xkey).root;
      uVar12 = 0;
      pAVar11 = (Atom *)0x0;
      AVar7 = _glfw.x11.NULL_;
      goto LAB_001123c6;
    }
    uVar5 = _glfwGetWindowPropertyX11
                      ((event->xkey).root,AVar1,_glfw.x11.ATOM_PAIR,(uchar **)targets);
    if (uVar5 != 0) {
      uVar9 = 0;
      do {
        pcVar4 = _glfw.x11.clipboardString;
        pDVar3 = _glfw.x11.display;
        AVar1 = *(Atom *)(targets[0] + uVar9 * 8);
        lVar8 = 0;
        do {
          if (AVar1 == formats[lVar8]) {
            WVar10 = (event->xkey).root;
            uVar12 = *(undefined8 *)(targets[0] + 8 + uVar9 * 8);
            sVar6 = strlen(_glfw.x11.clipboardString);
            XChangeProperty(pDVar3,WVar10,uVar12,AVar1,8,0,pcVar4,sVar6);
            goto LAB_0011247e;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        *(undefined8 *)(targets[0] + 8 + uVar9 * 8) = 0;
LAB_0011247e:
        uVar9 = uVar9 + 2;
      } while (uVar9 < uVar5);
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0,targets[0],uVar5);
    XFree(targets[0]);
  }
  AVar7 = (event->xselectionrequest).property;
LAB_001124cf:
  reply.type = 0x1f;
  reply.xany.display = (event->xany).display;
  reply.xany.window = (event->xkey).root;
  reply.xkey.root = (event->xkey).subwindow;
  reply.xkey.subwindow = (event->xkey).time;
  reply.xselectionrequest.property = (event->xconfigure).above;
  reply.xkey.time = AVar7;
  XSendEvent(_glfw.x11.display,reply.xany.window,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply;
    memset(&reply, 0, sizeof(reply));

    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.type = SelectionNotify;
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}